

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconsVisitor.cpp
# Opt level: O3

void __thiscall OpenMD::ZConsVisitor::update(ZConsVisitor *this)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  pointer pZVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  pointer pZVar6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  RealType time;
  
  p_Var1 = &(this->zmolStates_)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var5 = (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != p_Var1;
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5)) {
    *(undefined4 *)&p_Var5[1].field_0x4 = 1;
  }
  time = Snapshot::getTime(this->currSnapshot_);
  readZconsFile(this,time);
  pZVar6 = (this->zconsReader_->fixedZmolData_).
           super__Vector_base<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>._M_impl.
           super__Vector_impl_data._M_start;
  pZVar3 = (this->zconsReader_->fixedZmolData_).
           super__Vector_base<OpenMD::ZconsData,_std::allocator<OpenMD::ZconsData>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pZVar6 != pZVar3) {
    p_Var4 = (this->zmolStates_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      p_Var9 = &p_Var1->_M_header;
      if (p_Var4 != (_Base_ptr)0x0) {
        iVar2 = pZVar6->zmolIndex;
        p_Var7 = &p_Var1->_M_header;
        p_Var8 = p_Var4;
        do {
          if (iVar2 <= (int)p_Var8[1]._M_color) {
            p_Var7 = p_Var8;
          }
          p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < iVar2];
        } while (p_Var8 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 != p_Var1) &&
           (p_Var9 = p_Var7, iVar2 < (int)p_Var7[1]._M_color)) {
          p_Var9 = &p_Var1->_M_header;
        }
      }
      *(undefined4 *)&p_Var9[1].field_0x4 = 0;
      pZVar6 = pZVar6 + 1;
    } while (pZVar6 != pZVar3);
  }
  return;
}

Assistant:

void ZConsVisitor::update() {
    Vector3d com;
    std::map<int, ZConsState>::iterator i;
    for (i = zmolStates_.begin(); i != zmolStates_.end(); ++i) {
      i->second = zsMoving;
    }

    readZconsFile(currSnapshot_->getTime());

    const std::vector<ZconsData>& fixedZmolData =
        zconsReader_->getFixedZMolData();
    std::vector<ZconsData>::const_iterator j;
    for (j = fixedZmolData.begin(); j != fixedZmolData.end(); ++j) {
      std::map<int, ZConsState>::iterator k = zmolStates_.find(j->zmolIndex);
      assert(k != zmolStates_.end());
      k->second = zsFixed;
    }
  }